

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_statistics_helper.cpp
# Opt level: O2

RelationStats *
duckdb::RelationStatisticsHelper::CombineStatsOfReorderableOperator
          (RelationStats *__return_storage_ptr__,vector<duckdb::ColumnBinding,_true> *bindings,
          vector<duckdb::RelationStats,_true> *relation_stats)

{
  pointer pRVar1;
  reference __x;
  reference __x_00;
  ulong uVar2;
  idx_t i;
  ulong __n;
  pointer this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  RelationStats::RelationStats(__return_storage_ptr__);
  pRVar1 = (relation_stats->
           super_vector<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>).
           super__Vector_base<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>._M_impl
           .super__Vector_impl_data._M_finish;
  uVar2 = 0;
  for (this = (relation_stats->
              super_vector<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>).
              super__Vector_base<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>.
              _M_impl.super__Vector_impl_data._M_start; this != pRVar1; this = this + 1) {
    for (__n = 0; __n < (ulong)((long)(this->column_distinct_count).
                                      super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                                      .
                                      super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->column_distinct_count).
                                      super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                                      .
                                      super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1
        ) {
      __x = ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::at
                      ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)this
                       ,__n);
      ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::push_back
                ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
                 __return_storage_ptr__,__x);
      __x_00 = ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&this->column_names,__n);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__return_storage_ptr__->column_names,__x_00);
    }
    ::std::operator+(&local_50,"joined with ",&this->table_name);
    ::std::__cxx11::string::append((string *)&__return_storage_ptr__->table_name);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (uVar2 <= this->cardinality) {
      uVar2 = this->cardinality;
    }
  }
  __return_storage_ptr__->stats_initialized = true;
  __return_storage_ptr__->cardinality = uVar2;
  return __return_storage_ptr__;
}

Assistant:

RelationStats RelationStatisticsHelper::CombineStatsOfReorderableOperator(vector<ColumnBinding> &bindings,
                                                                          vector<RelationStats> relation_stats) {
	RelationStats stats;
	idx_t max_card = 0;
	for (auto &child_stats : relation_stats) {
		for (idx_t i = 0; i < child_stats.column_distinct_count.size(); i++) {
			stats.column_distinct_count.push_back(child_stats.column_distinct_count.at(i));
			stats.column_names.push_back(child_stats.column_names.at(i));
		}
		stats.table_name += "joined with " + child_stats.table_name;
		max_card = MaxValue(max_card, child_stats.cardinality);
	}
	stats.stats_initialized = true;
	stats.cardinality = max_card;
	return stats;
}